

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  Metadata MVar1;
  TextGenerator generator;
  StringOutputStream output_stream;
  TextGenerator local_68;
  StringOutputStream local_40;
  
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    io::StringOutputStream::StringOutputStream(&local_40,output);
    local_68.indent_level_ = this->initial_indent_level_;
    local_68.super_BaseTextGenerator._vptr_BaseTextGenerator =
         (_func_int **)&PTR__TextGenerator_00442fb8;
    local_68.buffer_ = (char *)0x0;
    local_68.buffer_size_ = 0;
    local_68.at_start_of_line_ = true;
    local_68.failed_ = false;
    local_68.insert_silent_marker_ = false;
    local_68.output_ = &local_40.super_ZeroCopyOutputStream;
    local_68.initial_indent_level_ = local_68.indent_level_;
    MVar1 = Message::GetMetadata(message);
    PrintFieldValue(this,message,MVar1.reflection,field,index,&local_68.super_BaseTextGenerator);
    TextGenerator::~TextGenerator(&local_68);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
             ,0x964,"output");
  absl::lts_20250127::log_internal::LogMessage::operator<<
            ((LogMessage *)&local_68,(char (*) [28])"output specified is nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  ABSL_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}